

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

string_view __thiscall
wabt::ObjdumpLocalNames::Get(ObjdumpLocalNames *this,Index function_index,Index param_2)

{
  bool bVar1;
  pointer ppVar2;
  string_view sVar3;
  _Self local_40;
  pair<unsigned_int,_unsigned_int> local_38;
  _Self local_30;
  const_iterator iter;
  Index local_index_local;
  Index function_index_local;
  ObjdumpLocalNames *this_local;
  char *local_10;
  
  iter._M_node._0_4_ = param_2;
  iter._M_node._4_4_ = function_index;
  std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int_&,_true>
            (&local_38,(uint *)((long)&iter._M_node + 4),(uint *)&iter);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->names,&local_38);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->names);
  bVar1 = std::operator==(&local_30,&local_40);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    sVar3._M_str = local_10;
    sVar3._M_len = (size_t)this_local;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_30);
    sVar3 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&ppVar2->second);
  }
  return sVar3;
}

Assistant:

std::string_view ObjdumpLocalNames::Get(Index function_index,
                                        Index local_index) const {
  auto iter = names.find(std::pair<Index, Index>(function_index, local_index));
  if (iter == names.end())
    return std::string_view();
  return iter->second;
}